

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPSocket::~UDPSocket(UDPSocket *this)

{
  UDPSocket *this_local;
  
  ~UDPSocket(this);
  operator_delete(this);
  return;
}

Assistant:

UDPSocket::~UDPSocket() {
#ifdef _WIN32
  closesocket(sockfd);
  WSACleanup();
#else
  close(sockfd);
#endif
}